

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_conn.cc
# Opt level: O3

Response * __thiscall
iqxmlrpc::Client_connection::process_session
          (Response *__return_storage_ptr__,Client_connection *this,Request *req,XHeaders *xheaders)

{
  long lVar1;
  int iVar2;
  Request_header *this_00;
  long *plVar3;
  Error_response *this_01;
  Client_options *pCVar4;
  Packet req_p;
  string req_xml_str;
  Packet local_a0;
  string local_68;
  string local_48;
  undefined4 extraout_var;
  
  dump_request_abi_cxx11_(&local_48,(iqxmlrpc *)req,req);
  this_00 = (Request_header *)operator_new(0xb0);
  (*this->_vptr_Client_connection[3])(&local_a0,this);
  pCVar4 = this->options;
  iVar2 = iqnet::Inet_addr::get_port(&pCVar4->addr_);
  http::Request_header::Request_header(this_00,(string *)&local_a0,&pCVar4->vhost_,iVar2);
  if ((shared_count *)local_a0._vptr_Packet != &local_a0.header_.pn) {
    operator_delete(local_a0._vptr_Packet,
                    (ulong)((long)&(local_a0.header_.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  pCVar4 = this->options;
  if ((pCVar4->auth_user_)._M_string_length != 0) {
    http::Request_header::set_authinfo(this_00,&pCVar4->auth_user_,&pCVar4->auth_passwd_);
    pCVar4 = this->options;
  }
  http::Header::set_xheaders((Header *)this_00,&pCVar4->xheaders_);
  http::Header::set_xheaders((Header *)this_00,xheaders);
  http::Packet::Packet(&local_a0,(Header *)this_00,&local_48);
  http::Packet::set_keep_alive(&local_a0,this->options->keep_alive_);
  http::Packet::dump_abi_cxx11_(&local_68,&local_a0);
  iVar2 = (*this->_vptr_Client_connection[2])(this,&local_68);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  lVar1 = plVar3[1];
  if (*(int *)(lVar1 + 0x8c) == 200) {
    parse_response(__return_storage_ptr__,(string *)(plVar3 + 3));
    (**(code **)(*plVar3 + 8))(plVar3);
    http::Packet::~Packet(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_01 = (Error_response *)__cxa_allocate_exception(0x50);
  http::Error_response::Error_response(this_01,(string *)(lVar1 + 0x90),*(int *)(lVar1 + 0x8c));
  __cxa_throw(this_01,&http::Error_response::typeinfo,http::Error_response::~Error_response);
}

Assistant:

Response Client_connection::process_session( const Request& req, const XHeaders& xheaders )
{
  using namespace http;

  std::string req_xml_str( dump_request(req) );

  std::auto_ptr<Request_header> req_h(
    new Request_header(
      decorate_uri(),
      opts().vhost(),
      opts().addr().get_port() ));

  if (opts().has_authinfo())
    req_h->set_authinfo( opts().auth_user(), opts().auth_passwd() );

  req_h->set_xheaders( opts().xheaders() );
  req_h->set_xheaders( xheaders );

  Packet req_p( req_h.release(), req_xml_str );
  req_p.set_keep_alive( opts().keep_alive() );

  // Received packet
  std::auto_ptr<Packet> res_p( do_process_session(req_p.dump()) );

  const Response_header* res_h =
    static_cast<const Response_header*>(res_p->header());

  if( res_h->code() != 200 )
    throw Error_response( res_h->phrase(), res_h->code() );

  return parse_response( res_p->content() );
}